

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O2

bool QPpmHandler::canRead(QIODevice *device,QByteArray *subType)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  QLoggingCategory *pQVar4;
  bool bVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  char head [2];
  undefined2 uStack_36;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (device == (QIODevice *)0x0) {
    pQVar4 = QtPrivateLogging::lcImageIo();
    if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) == 0) {
      bVar5 = false;
    }
    else {
      _head = 2;
      bVar5 = false;
      QMessageLogger::warning(head,"QPpmHandler::canRead() called with no device");
    }
    goto LAB_00296135;
  }
  _head = CONCAT22(uStack_36,0xaaaa);
  lVar2 = QIODevice::peek((char *)device,(longlong)head);
  bVar5 = false;
  if ((lVar2 != 2) || (bVar5 = false, head[0] != 'P')) goto LAB_00296135;
  uVar3 = (ulong)(byte)head[1];
  bVar5 = false;
  if (0x36 < uVar3) goto LAB_00296135;
  if ((0x12000000000000U >> (uVar3 & 0x3f) & 1) == 0) {
    if ((0x24000000000000U >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x48000000000000U >> (uVar3 & 0x3f) & 1) == 0) goto LAB_00296135;
      if (subType != (QByteArray *)0x0) {
        pcVar6 = "ppm";
        goto LAB_0029612a;
      }
    }
    else if (subType != (QByteArray *)0x0) {
      pcVar6 = "pgm";
      goto LAB_0029612a;
    }
  }
  else if (subType != (QByteArray *)0x0) {
    pcVar6 = "pbm";
LAB_0029612a:
    QByteArray::operator=(subType,pcVar6);
  }
  bVar5 = true;
LAB_00296135:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QPpmHandler::canRead(QIODevice *device, QByteArray *subType)
{
    if (!device) {
        qCWarning(lcImageIo, "QPpmHandler::canRead() called with no device");
        return false;
    }

    char head[2];
    if (device->peek(head, sizeof(head)) != sizeof(head))
        return false;

    if (head[0] != 'P')
        return false;

    if (head[1] == '1' || head[1] == '4') {
        if (subType)
            *subType = "pbm";
    } else if (head[1] == '2' || head[1] == '5') {
        if (subType)
            *subType = "pgm";
    } else if (head[1] == '3' || head[1] == '6') {
        if (subType)
            *subType = "ppm";
    } else {
        return false;
    }
    return true;
}